

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 float128_mul_mips(float128 a,float128 b,float_status *status)

{
  undefined1 auVar1 [16];
  uint64_t a_00;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong a_01;
  ulong uVar6;
  uint uVar7;
  int32_t zExp;
  bool bVar8;
  float128 fVar9;
  int32_t aExp;
  int32_t bExp;
  uint64_t aSig1;
  uint64_t more2;
  uint64_t z3;
  uint local_ac;
  float_status *local_a8;
  uint local_9c;
  ulong local_98;
  uint64_t local_90;
  uint64_t local_88;
  ulong local_80;
  ulong local_78;
  uint64_t local_70;
  ulong local_68;
  ulong local_60;
  uint64_t local_58;
  ulong local_50;
  uint64_t local_48;
  ulong local_40;
  uint64_t local_38;
  
  uVar2 = b.low;
  local_88 = a.low;
  local_80 = a.high & 0xffffffffffff;
  local_ac = a.high._6_2_ & 0x7fff;
  uVar6 = b.high & 0xffffffffffff;
  uVar7 = b.high._6_2_ & 0x7fff;
  uVar4 = b.high ^ a.high;
  local_9c = uVar7;
  local_90 = uVar2;
  local_60 = uVar6;
  if (local_ac == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
         local_88 != 0) ||
       ((((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar2 != 0) && uVar7 == 0x7fff)) {
LAB_0069c2d8:
      fVar9 = propagateFloat128NaN(a,b,status);
      return fVar9;
    }
    if ((((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        uVar2 == 0) &&
        ((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
LAB_0069c33d:
      status->float_exception_flags = status->float_exception_flags | 1;
      fVar9 = float128_default_nan_mips(status);
      return fVar9;
    }
  }
  else {
    if (uVar7 != 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
            local_88 != 0) {
          normalizeFloat128Subnormal(local_80,local_88,(int32_t *)&local_ac,&local_80,&local_88);
          goto LAB_0069c31f;
        }
      }
      else {
LAB_0069c31f:
        local_a8 = status;
        if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) != (undefined1  [16])0x0) {
LAB_0069c39c:
          a_00 = local_88;
          local_68 = uVar4 >> 0x3f;
          local_98 = (ulong)local_ac;
          a_01 = local_80 | 0x1000000000000;
          uVar6 = uVar6 << 0x10 | uVar2 >> 0x30;
          local_70 = local_88;
          mul64To128(local_88,uVar2 << 0x10,&local_50,&local_58);
          mul64To128(a_00,uVar6,&local_38,&local_78);
          uVar3 = local_50 + local_78;
          uVar5 = local_38 + CARRY8(local_50,local_78);
          mul64To128(a_01,uVar6,&local_48,&local_40);
          bVar8 = CARRY8(uVar5,local_40);
          uVar5 = uVar5 + local_40;
          mul64To128(a_01,uVar2 << 0x10,&local_40,&local_78);
          uVar4 = local_40 + uVar5 + (ulong)CARRY8(uVar3,local_78);
          uVar6 = uVar4 + local_70;
          uVar2 = (ulong)(uVar4 < uVar5) + local_48 + a_01 + (ulong)bVar8 +
                  (ulong)CARRY8(uVar4,local_70);
          uVar4 = (ulong)(local_58 != 0) | uVar3 + local_78;
          if (uVar2 >> 0x31 == 0) {
            zExp = uVar7 + (int)local_98 + -0x4000;
          }
          else {
            uVar3 = uVar2 << 0x3f;
            uVar2 = uVar2 >> 1;
            uVar4 = (ulong)(uVar4 != 0) | uVar6 << 0x3f;
            zExp = uVar7 + (int)local_98 + -0x3fff;
            uVar6 = uVar3 | uVar6 >> 1;
          }
          fVar9 = roundAndPackFloat128((flag)local_68,zExp,uVar2,uVar6,uVar4,local_a8);
          return fVar9;
        }
        if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
            uVar2 != 0) {
          normalizeFloat128Subnormal(uVar6,uVar2,(int32_t *)&local_9c,&local_60,&local_90);
          uVar6 = local_60;
          uVar2 = local_90;
          uVar7 = local_9c;
          goto LAB_0069c39c;
        }
      }
      uVar4 = uVar4 & 0x8000000000000000;
      goto LAB_0069c4ff;
    }
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar2 != 0) goto LAB_0069c2d8;
    if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        local_88 == 0) &&
        ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0)
    goto LAB_0069c33d;
  }
  uVar4 = uVar4 & 0x8000000000000000 | 0x7fff000000000000;
LAB_0069c4ff:
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  return (float128)(auVar1 << 0x40);
}

Assistant:

float128 float128_mul(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2, zSig3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( bExp | bSig0 | bSig1 ) == 0 ) goto invalid;
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    zExp = aExp + bExp - 0x4000;
    aSig0 |= UINT64_C(0x0001000000000000);
    shortShift128Left( bSig0, bSig1, 16, &bSig0, &bSig1 );
    mul128To256( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1, &zSig2, &zSig3 );
    add128( zSig0, zSig1, aSig0, aSig1, &zSig0, &zSig1 );
    zSig2 |= ( zSig3 != 0 );
    if (UINT64_C( 0x0002000000000000) <= zSig0 ) {
        shift128ExtraRightJamming(
            zSig0, zSig1, zSig2, 1, &zSig0, &zSig1, &zSig2 );
        ++zExp;
    }
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}